

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CProgram *stm)

{
  CMainClass *pCVar1;
  CClassList *pCVar2;
  string *this_00;
  undefined1 local_50 [48];
  
  std::operator<<((ostream *)&std::cout,"typechecker: program\n");
  pCVar1 = (stm->mainClass)._M_t.super___uniq_ptr_impl<CMainClass,_std::default_delete<CMainClass>_>
           ._M_t.super__Tuple_impl<0UL,_CMainClass_*,_std::default_delete<CMainClass>_>.
           super__Head_base<0UL,_CMainClass_*,_false>._M_head_impl;
  if (pCVar1 == (CMainClass *)0x0) {
    CError::CError((CError *)local_50,&CError::AST_ERROR_abi_cxx11_,(PositionInfo *)&DAT_00000008);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_50);
    this_00 = (string *)local_50;
  }
  else {
    (*(code *)**(undefined8 **)&(pCVar1->super_IWrapper).super_PositionedNode)(pCVar1,this);
    TypeInfo::TypeInfo((TypeInfo *)local_50,VOID);
    TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)local_50);
    this_00 = (string *)(local_50 + 8);
  }
  std::__cxx11::string::~string(this_00);
  pCVar2 = (stm->classList)._M_t.super___uniq_ptr_impl<CClassList,_std::default_delete<CClassList>_>
           ._M_t.super__Tuple_impl<0UL,_CClassList_*,_std::default_delete<CClassList>_>.
           super__Head_base<0UL,_CClassList_*,_false>._M_head_impl;
  if (pCVar2 != (CClassList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar2->super_IWrapper).super_PositionedNode)(pCVar2,this);
    TypeInfo::TypeInfo((TypeInfo *)local_50,VOID);
    TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)local_50);
    std::__cxx11::string::~string((string *)(local_50 + 8));
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CProgram &stm )
{
    std::cout << "typechecker: program\n";
    if( stm.mainClass ) {
        stm.mainClass->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.mainClass->position ) );
    }
    if( stm.classList ) {
        stm.classList->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    }
}